

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void notValid(Parse *pParse,NameContext *pNC,char *zMsg,int validMask)

{
  char *pcVar1;
  char *pcVar2;
  
  if (((uint)pNC & 0xffff & validMask) != 0) {
    pcVar2 = "CHECK constraints";
    if (((ulong)pNC & 4) == 0) {
      pcVar2 = "partial index WHERE clauses";
    }
    pcVar1 = "index expressions";
    if (((ulong)pNC & 0x20) == 0) {
      pcVar1 = pcVar2;
    }
    sqlite3ErrorMsg(pParse,"%s prohibited in %s",zMsg,pcVar1);
    return;
  }
  return;
}

Assistant:

static void notValid(
  Parse *pParse,       /* Leave error message here */
  NameContext *pNC,    /* The name context */
  const char *zMsg,    /* Type of error */
  int validMask        /* Set of contexts for which prohibited */
){
  assert( (validMask&~(NC_IsCheck|NC_PartIdx|NC_IdxExpr))==0 );
  if( (pNC->ncFlags & validMask)!=0 ){
    const char *zIn = "partial index WHERE clauses";
    if( pNC->ncFlags & NC_IdxExpr )      zIn = "index expressions";
#ifndef SQLITE_OMIT_CHECK
    else if( pNC->ncFlags & NC_IsCheck ) zIn = "CHECK constraints";
#endif
    sqlite3ErrorMsg(pParse, "%s prohibited in %s", zMsg, zIn);
  }
}